

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O0

void __thiscall wasm::InstrumentLocals::visitLocalSet(InstrumentLocals *this,LocalSet *curr)

{
  char **this_00;
  Index x;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  bool bVar1;
  BasicType BVar2;
  Module *wasm;
  Call *pCVar3;
  bool local_d3;
  bool local_d2;
  bool local_d1;
  allocator<wasm::Expression_*> local_a9;
  Const *local_a8;
  Const *local_a0;
  Expression *local_98;
  Const **local_90;
  size_type local_88;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_80;
  size_t local_68;
  char *pcStack_60;
  BasicHeapType local_58 [2];
  HeapType local_50;
  HeapType heapType;
  HeapType local_40;
  Type local_38;
  Type type;
  Name import;
  Builder builder;
  LocalSet *curr_local;
  InstrumentLocals *this_local;
  
  bVar1 = Expression::is<wasm::Pop>(curr->value);
  if (bVar1) {
    return;
  }
  wasm = Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>::getModule
                   (&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
                     ).
                     super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
                     .
                     super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
                   );
  Builder::Builder((Builder *)&import.super_IString.str._M_str,wasm);
  wasm::Name::Name((Name *)&type);
  local_38.id = (curr->value->type).id;
  bVar1 = wasm::Type::isFunction(&local_38);
  local_d1 = false;
  if (bVar1) {
    local_40 = wasm::Type::getHeapType(&local_38);
    heapType.id._4_4_ = 1;
    local_d1 = HeapType::operator!=(&local_40,(BasicHeapType *)((long)&heapType.id + 4));
  }
  if (local_d1 != false) {
    return;
  }
  bVar1 = wasm::Type::isRef(&local_38);
  if (bVar1) {
    local_50 = wasm::Type::getHeapType(&local_38);
    local_58[1] = 1;
    bVar1 = HeapType::operator==(&local_50,local_58 + 1);
    local_d2 = false;
    if (bVar1) {
      local_d2 = wasm::Type::isNullable(&local_38);
    }
    if (local_d2 == false) {
      local_58[0] = ext;
      bVar1 = HeapType::operator==(&local_50,local_58);
      local_d3 = false;
      if (bVar1) {
        local_d3 = wasm::Type::isNullable(&local_38);
      }
      if (local_d3 == false) {
        handle_unreachable("TODO: general reference types",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                           ,0x86);
      }
      wasm::Name::operator=((Name *)&type,(Name *)&set_externref);
    }
    else {
      wasm::Name::operator=((Name *)&type,(Name *)&set_funcref);
    }
  }
  else {
    bVar1 = wasm::Type::isTuple(&curr->value->type);
    if (bVar1) {
      __assert_fail("!curr->value->type.isTuple() && \"Unexpected tuple type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                    ,0x89,"void wasm::InstrumentLocals::visitLocalSet(LocalSet *)");
    }
    bVar1 = wasm::Type::isBasic(&curr->value->type);
    if (!bVar1) {
      __assert_fail("curr->value->type.isBasic() && \"TODO: handle compound types\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                    ,0x89,"void wasm::InstrumentLocals::visitLocalSet(LocalSet *)");
    }
    BVar2 = wasm::Type::getBasic(&local_38);
    switch(BVar2) {
    case none:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/InstrumentLocals.cpp"
                         ,0x9c);
    case unreachable:
      return;
    case i32:
      wasm::Name::operator=((Name *)&type,(Name *)&set_i32);
      break;
    case i64:
      return;
    case f32:
      wasm::Name::operator=((Name *)&type,(Name *)&set_f32);
      break;
    case f64:
      wasm::Name::operator=((Name *)&type,(Name *)&set_f64);
      break;
    case v128:
      wasm::Name::operator=((Name *)&type,(Name *)&set_v128);
    }
  }
  local_68 = type.id;
  pcStack_60 = (char *)import.super_IString.str._M_len;
  x = this->id;
  this->id = x + 1;
  this_00 = &import.super_IString.str._M_str;
  local_a8 = Builder::makeConst<int>((Builder *)this_00,x);
  local_a0 = Builder::makeConst<int>((Builder *)this_00,curr->index);
  local_98 = curr->value;
  local_90 = &local_a8;
  local_88 = 3;
  std::allocator<wasm::Expression_*>::allocator(&local_a9);
  __l._M_len = local_88;
  __l._M_array = (iterator)local_90;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_80,__l,&local_a9);
  target.super_IString.str._M_str = pcStack_60;
  target.super_IString.str._M_len = local_68;
  pCVar3 = Builder::makeCall((Builder *)&import.super_IString.str._M_str,target,&local_80,
                             (Type)(curr->value->type).id,false);
  curr->value = (Expression *)pCVar3;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_80);
  std::allocator<wasm::Expression_*>::~allocator(&local_a9);
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
    // We don't instrument pop instructions. They are automatically deleted when
    // writing binary and generated when reading binary, so they don't work with
    // local set/get instrumentation.
    if (curr->value->is<Pop>()) {
      return;
    }

    Builder builder(*getModule());
    Name import;
    auto type = curr->value->type;
    if (type.isFunction() && type.getHeapType() != HeapType::func) {
      // FIXME: support typed function references
      return;
    }
    if (type.isRef()) {
      auto heapType = type.getHeapType();
      if (heapType == HeapType::func && type.isNullable()) {
        import = set_funcref;
      } else if (heapType == HeapType::ext && type.isNullable()) {
        import = set_externref;
      } else {
        WASM_UNREACHABLE("TODO: general reference types");
      }
    } else {
      TODO_SINGLE_COMPOUND(curr->value->type);
      switch (type.getBasic()) {
        case Type::i32:
          import = set_i32;
          break;
        case Type::i64:
          return; // TODO
        case Type::f32:
          import = set_f32;
          break;
        case Type::f64:
          import = set_f64;
          break;
        case Type::v128:
          import = set_v128;
          break;
        case Type::unreachable:
          return; // nothing to do here
        case Type::none:
          WASM_UNREACHABLE("unexpected type");
      }
    }
    curr->value = builder.makeCall(import,
                                   {builder.makeConst(int32_t(id++)),
                                    builder.makeConst(int32_t(curr->index)),
                                    curr->value},
                                   curr->value->type);
  }